

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall google::protobuf::internal::ExtensionSet::Extension::Clear(Extension *this)

{
  LongSooRep *pLVar1;
  ulong uVar2;
  undefined8 *puVar3;
  int iVar4;
  AllocatedData AVar5;
  string *extraout_RAX;
  string *extraout_RAX_00;
  Extension *pEVar6;
  string *psVar7;
  string *extraout_RAX_01;
  uint uVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  uint extraout_EDX;
  FieldDescriptor *extraout_RDX;
  int in_ESI;
  ExtensionSet *pEVar11;
  FieldDescriptor *in_R8;
  bool bVar12;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar13;
  ExtensionSet EStack_a8;
  ExtensionSet EStack_70;
  ExtensionSet EStack_48;
  
  pEVar11 = (ExtensionSet *)&stack0xffffffffffffffd8;
  if (this->is_repeated == true) {
    uVar8 = this->type - 0x13;
    puVar9 = (undefined1 *)(ulong)uVar8;
    if (0xed < (byte)uVar8) {
      switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)this->type * 4)) {
      case 1:
      case 8:
        pLVar1 = *(LongSooRep **)&(this->field_0).int32_t_value;
        uVar2 = pLVar1->elements_int;
        if ((uVar2 & 4) != 0) {
          LongSooRep::elements(pLVar1);
        }
        break;
      case 2:
        pLVar1 = *(LongSooRep **)&(this->field_0).int32_t_value;
        uVar2 = pLVar1->elements_int;
        if ((uVar2 & 4) != 0) {
          LongSooRep::elements(pLVar1);
        }
        bVar12 = (uVar2 & 4) == 0;
        SooRep::size((SooRep *)pLVar1,bVar12);
        iVar4 = SooRep::size((SooRep *)pLVar1,bVar12);
        if ((iVar4 != 0) && ((pLVar1->elements_int & 4) != 0)) {
          LongSooRep::elements(pLVar1);
        }
        RepeatedField<long>::set_size((RepeatedField<long> *)pLVar1,(uVar2 & 4) == 0,0);
        return;
      case 3:
        pLVar1 = *(LongSooRep **)&(this->field_0).int32_t_value;
        uVar2 = pLVar1->elements_int;
        if ((uVar2 & 4) != 0) {
          LongSooRep::elements(pLVar1);
        }
        bVar12 = (uVar2 & 4) == 0;
        SooRep::size((SooRep *)pLVar1,bVar12);
        iVar4 = SooRep::size((SooRep *)pLVar1,bVar12);
        if ((iVar4 != 0) && ((pLVar1->elements_int & 4) != 0)) {
          LongSooRep::elements(pLVar1);
        }
        RepeatedField<unsigned_int>::set_size
                  ((RepeatedField<unsigned_int> *)pLVar1,(uVar2 & 4) == 0,0);
        return;
      case 4:
        pLVar1 = *(LongSooRep **)&(this->field_0).int32_t_value;
        uVar2 = pLVar1->elements_int;
        if ((uVar2 & 4) != 0) {
          LongSooRep::elements(pLVar1);
        }
        bVar12 = (uVar2 & 4) == 0;
        SooRep::size((SooRep *)pLVar1,bVar12);
        iVar4 = SooRep::size((SooRep *)pLVar1,bVar12);
        if ((iVar4 != 0) && ((pLVar1->elements_int & 4) != 0)) {
          LongSooRep::elements(pLVar1);
        }
        RepeatedField<unsigned_long>::set_size
                  ((RepeatedField<unsigned_long> *)pLVar1,(uVar2 & 4) == 0,0);
        return;
      case 5:
        pLVar1 = *(LongSooRep **)&(this->field_0).int32_t_value;
        uVar2 = pLVar1->elements_int;
        if ((uVar2 & 4) != 0) {
          LongSooRep::elements(pLVar1);
        }
        bVar12 = (uVar2 & 4) == 0;
        SooRep::size((SooRep *)pLVar1,bVar12);
        iVar4 = SooRep::size((SooRep *)pLVar1,bVar12);
        if ((iVar4 != 0) && ((pLVar1->elements_int & 4) != 0)) {
          LongSooRep::elements(pLVar1);
        }
        RepeatedField<double>::set_size((RepeatedField<double> *)pLVar1,(uVar2 & 4) == 0,0);
        return;
      case 6:
        pLVar1 = *(LongSooRep **)&(this->field_0).int32_t_value;
        uVar2 = pLVar1->elements_int;
        if ((uVar2 & 4) != 0) {
          LongSooRep::elements(pLVar1);
        }
        bVar12 = (uVar2 & 4) == 0;
        SooRep::size((SooRep *)pLVar1,bVar12);
        iVar4 = SooRep::size((SooRep *)pLVar1,bVar12);
        if ((iVar4 != 0) && ((pLVar1->elements_int & 4) != 0)) {
          LongSooRep::elements(pLVar1);
        }
        RepeatedField<float>::set_size((RepeatedField<float> *)pLVar1,(uVar2 & 4) == 0,0);
        return;
      case 7:
        pLVar1 = *(LongSooRep **)&(this->field_0).int32_t_value;
        uVar2 = pLVar1->elements_int;
        if ((uVar2 & 4) != 0) {
          LongSooRep::elements(pLVar1);
        }
        bVar12 = (uVar2 & 4) == 0;
        SooRep::size((SooRep *)pLVar1,bVar12);
        iVar4 = SooRep::size((SooRep *)pLVar1,bVar12);
        if ((iVar4 != 0) && ((pLVar1->elements_int & 4) != 0)) {
          LongSooRep::elements(pLVar1);
        }
        RepeatedField<bool>::set_size((RepeatedField<bool> *)pLVar1,(uVar2 & 4) == 0,0);
        return;
      case 9:
        RepeatedPtrFieldBase::
        Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                  ((RepeatedPtrFieldBase *)this->field_0);
        return;
      case 10:
        RepeatedPtrFieldBase::
        Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                  ((RepeatedPtrFieldBase *)this->field_0);
        return;
      default:
        return;
      }
      bVar12 = (uVar2 & 4) == 0;
      SooRep::size((SooRep *)pLVar1,bVar12);
      iVar4 = SooRep::size((SooRep *)pLVar1,bVar12);
      if ((iVar4 != 0) && ((pLVar1->elements_int & 4) != 0)) {
        LongSooRep::elements(pLVar1);
      }
      RepeatedField<int>::set_size((RepeatedField<int> *)pLVar1,(uVar2 & 4) == 0,0);
      return;
    }
    Clear((Extension *)&stack0xffffffffffffffd8);
  }
  else {
    if ((this->field_0xa & 2) != 0) {
      return;
    }
    puVar9 = (undefined1 *)(ulong)this->type;
    if (0xed < (byte)(this->type - 0x13)) {
      if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (long)puVar9 * 4) == 10) {
        if ((this->field_0xa & 4) == 0) {
          (**(code **)(*(long *)this->field_0 + 0x10))();
        }
        else {
          (**(code **)(*(long *)this->field_0 + 0x88))();
        }
      }
      else if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (long)puVar9 * 4) == 9) {
        puVar3 = (undefined8 *)(this->field_0).int64_t_value;
        puVar3[1] = 0;
        *(undefined1 *)*puVar3 = 0;
      }
      this->field_0xa = this->field_0xa | 2;
      return;
    }
  }
  Clear((Extension *)&stack0xffffffffffffffd8);
  EStack_48.map_ = (AllocatedData)this;
  AVar5.flat = (KeyValue *)FindOrNull(pEVar11,in_ESI);
  if (AVar5.flat == (KeyValue *)0x0) {
    return;
  }
  if ((((AVar5.flat)->second).field_0.uint64_t_value & 0x20000) != 0) {
    return;
  }
  if (*(bool *)((long)&((AVar5.flat)->second).field_0 + 1) == false) {
    psVar7 = (string *)0x0;
  }
  else {
    psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       (0,1,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                       );
  }
  if (psVar7 == (string *)0x0) {
    bVar12 = ((AVar5.flat)->second).field_0.bool_value;
    uVar8 = bVar12 - 0x13;
    puVar9 = (undefined1 *)(ulong)uVar8;
    if ((byte)uVar8 < 0xee) {
      pEVar11 = &EStack_48;
      GetInt32();
LAB_001370cf:
      psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)pEVar11,1,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_INT32");
    }
    else {
      puVar9 = WireFormatLite::kFieldTypeToCppTypeMap;
      pEVar11 = (ExtensionSet *)
                (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar12 * 4);
      if (pEVar11 != (ExtensionSet *)0x1) goto LAB_001370cf;
      psVar7 = (string *)0x0;
    }
    if (psVar7 == (string *)0x0) {
      return;
    }
  }
  else {
    GetInt32();
    psVar7 = extraout_RAX;
  }
  iVar4 = (int)psVar7;
  pEVar11 = &EStack_48;
  GetInt32();
  EStack_70.map_.flat = AVar5.flat;
  AVar5.flat = (KeyValue *)FindOrNull(pEVar11,iVar4);
  if (AVar5.flat == (KeyValue *)0x0) {
    return;
  }
  if ((((AVar5.flat)->second).field_0.uint64_t_value & 0x20000) != 0) {
    return;
  }
  if (*(bool *)((long)&((AVar5.flat)->second).field_0 + 1) == false) {
    psVar7 = (string *)0x0;
  }
  else {
    psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       (0,1,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                       );
  }
  if (psVar7 == (string *)0x0) {
    bVar12 = ((AVar5.flat)->second).field_0.bool_value;
    uVar8 = bVar12 - 0x13;
    puVar9 = (undefined1 *)(ulong)uVar8;
    if ((byte)uVar8 < 0xee) {
      pEVar11 = &EStack_70;
      GetRefInt32();
LAB_00137176:
      psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)pEVar11,1,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_INT32");
    }
    else {
      puVar9 = WireFormatLite::kFieldTypeToCppTypeMap;
      pEVar11 = (ExtensionSet *)
                (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar12 * 4);
      if (pEVar11 != (ExtensionSet *)0x1) goto LAB_00137176;
      psVar7 = (string *)0x0;
    }
    if (psVar7 == (string *)0x0) {
      return;
    }
  }
  else {
    GetRefInt32();
    psVar7 = extraout_RAX_00;
  }
  iVar4 = (int)psVar7;
  pEVar11 = &EStack_70;
  GetRefInt32();
  puVar10 = puVar9;
  EStack_a8.map_.flat = AVar5.flat;
  pVar13 = Insert(pEVar11,iVar4);
  pEVar6 = pVar13.first;
  pEVar6->descriptor = in_R8;
  if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar6->is_repeated != false) goto LAB_0013725b;
    psVar7 = (string *)0x0;
LAB_0013720c:
    if (psVar7 == (string *)0x0) {
      uVar8 = pEVar6->type - 0x13;
      puVar10 = (undefined1 *)(ulong)uVar8;
      if (0xed < (byte)uVar8) {
        puVar10 = WireFormatLite::kFieldTypeToCppTypeMap;
        if ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar6->type * 4) == 1)
        {
          psVar7 = (string *)0x0;
        }
        else {
          psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                             ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap +
                                              (ulong)pEVar6->type * 4),1,
                              "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_INT32");
        }
        if (psVar7 == (string *)0x0) goto LAB_0013723d;
        goto LAB_001372bd;
      }
      pEVar11 = &EStack_a8;
      SetInt32(pEVar11);
LAB_0013727a:
      psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)pEVar11,1,
                          "cpp_type(extension->type) == WireFormatLite::CPPTYPE_INT32");
      goto LAB_001371ee;
    }
    SetInt32();
  }
  else {
    pEVar6->type = (FieldType)extraout_EDX;
    if ((byte)((FieldType)extraout_EDX - 0x13) < 0xee) {
      SetInt32(&EStack_a8);
LAB_0013725b:
      psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         (0,1,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                         );
      goto LAB_0013720c;
    }
    puVar10 = WireFormatLite::kFieldTypeToCppTypeMap;
    pEVar11 = (ExtensionSet *)
              (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap +
                              (ulong)(extraout_EDX & 0xff) * 4);
    if (pEVar11 != (ExtensionSet *)0x1) goto LAB_0013727a;
    psVar7 = (string *)0x0;
LAB_001371ee:
    if (psVar7 == (string *)0x0) {
      pEVar6->is_repeated = false;
      pEVar6->field_0xa = pEVar6->field_0xa & 0xfe;
LAB_0013723d:
      pEVar6->field_0xa = pEVar6->field_0xa & 0xfd;
      (pEVar6->field_0).int32_t_value = (int32_t)puVar9;
      return;
    }
  }
  SetInt32();
  psVar7 = extraout_RAX_01;
LAB_001372bd:
  iVar4 = (int)psVar7;
  pEVar11 = &EStack_a8;
  SetInt32();
  pVar13 = Insert(pEVar11,iVar4);
  *(Extension **)puVar10 = pVar13.first;
  (pVar13.first)->descriptor = extraout_RDX;
  return;
}

Assistant:

void ExtensionSet::Extension::Clear() {
  if (is_repeated) {
    switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)      \
  case WireFormatLite::CPPTYPE_##UPPERCASE:    \
    ptr.repeated_##LOWERCASE##_value->Clear(); \
    break

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, enum);
      HANDLE_TYPE(STRING, string);
      HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
    }
  } else {
    if (!is_cleared) {
      switch (cpp_type(type)) {
        case WireFormatLite::CPPTYPE_STRING:
          ptr.string_value->clear();
          break;
        case WireFormatLite::CPPTYPE_MESSAGE:
          if (is_lazy) {
            ptr.lazymessage_value->Clear();
          } else {
            ptr.message_value->Clear();
          }
          break;
        default:
          // No need to do anything.  Get*() will return the default value
          // as long as is_cleared is true and Set*() will overwrite the
          // previous value.
          break;
      }

      is_cleared = true;
    }
  }
}